

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmExpandedCommandArgument *pcVar1;
  iterator iVar2;
  iterator iVar3;
  cmMakefile *pcVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  ostream *poVar8;
  string *psVar9;
  cmState *pcVar10;
  cmTest *pcVar11;
  cmValue cVar12;
  PolicyID id;
  size_t in_R8;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  static_string_view keyword_04;
  static_string_view keyword_05;
  static_string_view keyword_06;
  static_string_view keyword_07;
  static_string_view keyword_08;
  CurrentAndNextIter args;
  CurrentAndNextIter args_00;
  static_string_view prefix;
  static_string_view prefix_00;
  ostringstream e;
  string local_1c8;
  _Any_data local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  iVar2._M_node =
       (newArgs->super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  pcVar5 = DAT_00874638;
  sVar6 = (anonymous_namespace)::keyTEST;
  do {
    if (iVar2._M_node == (_List_node_base *)newArgs) {
      (anonymous_namespace)::keyTEST = sVar6;
      DAT_00874638 = pcVar5;
      return true;
    }
    iVar3._M_node =
         (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
          &(iVar2._M_node)->_M_next)->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    (anonymous_namespace)::keyTEST = sVar6;
    DAT_00874638 = pcVar5;
    if ((this->Policy64Status == WARN) &&
       (keyword.super_string_view._M_str = pcVar5, keyword.super_string_view._M_len = sVar6,
       bVar7 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(iVar2._M_node + 1)), bVar7)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_pod_data);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x40,id);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,local_1c8._M_dataplus._M_p,
                          local_1c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 " will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                 ,0x7e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_pod_data);
      std::ios_base::~ios_base(local_138);
    }
    if (iVar3._M_node == (_List_node_base *)newArgs) goto LAB_0046c978;
    pcVar1 = (cmExpandedCommandArgument *)(iVar2._M_node + 1);
    keyword_00.super_string_view._M_str = DAT_008744d8;
    keyword_00.super_string_view._M_len = (anonymous_namespace)::keyEXISTS;
    bVar7 = IsKeyword(this,keyword_00,pcVar1);
    if (bVar7) {
      psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                         ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
      bVar7 = cmsys::SystemTools::FileExists(psVar9);
LAB_0046c96a:
      args.next._M_node = iVar3._M_node;
      args.current._M_node = iVar2._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,bVar7,args);
    }
    else {
      keyword_01.super_string_view._M_str = DAT_00874528;
      keyword_01.super_string_view._M_len = (anonymous_namespace)::keyIS_DIRECTORY;
      bVar7 = IsKeyword(this,keyword_01,pcVar1);
      if (bVar7) {
        psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        bVar7 = cmsys::SystemTools::FileIsDirectory(psVar9);
        goto LAB_0046c96a;
      }
      keyword_02.super_string_view._M_str = DAT_00874548;
      keyword_02.super_string_view._M_len = (anonymous_namespace)::keyIS_SYMLINK;
      bVar7 = IsKeyword(this,keyword_02,pcVar1);
      if (bVar7) {
        psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        bVar7 = cmsys::SystemTools::FileIsSymlink(psVar9);
        goto LAB_0046c96a;
      }
      keyword_03.super_string_view._M_str = DAT_00874518;
      keyword_03.super_string_view._M_len = (anonymous_namespace)::keyIS_ABSOLUTE;
      bVar7 = IsKeyword(this,keyword_03,pcVar1);
      if (bVar7) {
        psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        bVar7 = cmsys::SystemTools::FileIsFullPath(psVar9);
        goto LAB_0046c96a;
      }
      keyword_04.super_string_view._M_str = DAT_008744a8;
      keyword_04.super_string_view._M_len = (anonymous_namespace)::keyCOMMAND;
      bVar7 = IsKeyword(this,keyword_04,pcVar1);
      if (!bVar7) {
        keyword_05.super_string_view._M_str = DAT_008745c8;
        keyword_05.super_string_view._M_len = (anonymous_namespace)::keyPOLICY;
        bVar7 = IsKeyword(this,keyword_05,pcVar1);
        if (bVar7) {
          psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
          bVar7 = cmPolicies::GetPolicyID
                            ((psVar9->_M_dataplus)._M_p,(PolicyID *)local_1a8._M_pod_data);
        }
        else {
          keyword_06.super_string_view._M_str = DAT_00874628;
          keyword_06.super_string_view._M_len = (anonymous_namespace)::keyTARGET;
          bVar7 = IsKeyword(this,keyword_06,pcVar1);
          if (bVar7) {
            pcVar4 = this->Makefile;
            psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
            pcVar11 = (cmTest *)cmMakefile::FindTargetToUse(pcVar4,psVar9,false);
          }
          else {
            keyword_07.super_string_view._M_str = DAT_008744b8;
            keyword_07.super_string_view._M_len = (anonymous_namespace)::keyDEFINED;
            bVar7 = IsKeyword(this,keyword_07,pcVar1);
            if (bVar7) {
              pcVar1 = (cmExpandedCommandArgument *)(iVar3._M_node + 1);
              psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
              pcVar5 = (char *)psVar9->_M_string_length;
              prefix.super_string_view._M_str = pcVar5;
              prefix.super_string_view._M_len = (size_t)"ENV";
              bVar7 = anon_unknown.dwarf_1c4badf::looksLikeSpecialVariable
                                ((anon_unknown_dwarf_1c4badf *)psVar9,(string *)0x3,prefix,in_R8);
              if (bVar7) {
                psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
                std::__cxx11::string::substr((ulong)&local_1a8,(ulong)psVar9);
                bVar7 = cmsys::SystemTools::HasEnv((string *)&local_1a8);
              }
              else {
                prefix_00.super_string_view._M_str = pcVar5;
                prefix_00.super_string_view._M_len = (size_t)"CACHE";
                bVar7 = anon_unknown.dwarf_1c4badf::looksLikeSpecialVariable
                                  ((anon_unknown_dwarf_1c4badf *)psVar9,(string *)0x5,prefix_00,
                                   in_R8);
                if (!bVar7) {
                  pcVar4 = this->Makefile;
                  psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
                  bVar7 = cmMakefile::IsDefinitionSet(pcVar4,psVar9);
                  goto LAB_0046c96a;
                }
                psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar1);
                std::__cxx11::string::substr((ulong)&local_1a8,(ulong)psVar9);
                pcVar10 = cmMakefile::GetState(this->Makefile);
                cVar12 = cmState::GetCacheEntryValue(pcVar10,(string *)&local_1a8);
                bVar7 = cVar12.Value != (string *)0x0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_unused._0_8_ != local_198) {
                operator_delete(local_1a8._M_unused._M_object,
                                (ulong)(local_198[0]._M_allocated_capacity + 1));
              }
              goto LAB_0046c96a;
            }
            keyword_08.super_string_view._M_str = DAT_00874638;
            keyword_08.super_string_view._M_len = (anonymous_namespace)::keyTEST;
            bVar7 = IsKeyword(this,keyword_08,pcVar1);
            if ((!bVar7) || (this->Policy64Status < NEW)) goto LAB_0046c978;
            pcVar4 = this->Makefile;
            psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
            pcVar11 = cmMakefile::GetTest(pcVar4,psVar9);
          }
          bVar7 = pcVar11 != (cmTest *)0x0;
        }
        goto LAB_0046c96a;
      }
      pcVar10 = cmMakefile::GetState(this->Makefile);
      psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                         ((cmExpandedCommandArgument *)(iVar3._M_node + 1));
      cmState::GetCommand((Command *)&local_1a8,pcVar10,psVar9);
      args_00.next._M_node = iVar3._M_node;
      args_00.current._M_node = iVar2._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,(code *)local_198[0]._0_8_ != (code *)0x0,args_00);
      if ((code *)local_198[0]._0_8_ != (code *)0x0) {
        (*(code *)local_198[0]._0_8_)(&local_1a8,&local_1a8,3);
      }
    }
LAB_0046c978:
    iVar2._M_node =
         (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
          &(iVar2._M_node)->_M_next)->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    pcVar5 = DAT_00874638;
    sVar6 = (anonymous_namespace)::keyTEST;
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList& newArgs, std::string&,
                                        MessageType&)
{
  for (auto args = newArgs.make2ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    auto policyCheck = [&, this](const cmPolicies::PolicyID id,
                                 const cmPolicies::PolicyStatus status,
                                 const cm::static_string_view kw) {
      if (status == cmPolicies::WARN && this->IsKeyword(kw, *args.current)) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(id) << "\n"
          << kw
          << " will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    };

    // NOTE Checking policies for warnings are not require an access to the
    // next arg. Check them first!
    policyCheck(cmPolicies::CMP0064, this->Policy64Status, keyTEST);

    // NOTE Fail fast: All the predicates below require the next arg to be
    // valid
    if (args.next == newArgs.end()) {
      continue;
    }

    // does a file exist
    if (this->IsKeyword(keyEXISTS, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::FileExists(args.next->GetValue()),
                           args);
    }
    // does a directory with this name exist
    else if (this->IsKeyword(keyIS_DIRECTORY, *args.current)) {
      newArgs.ReduceOneArg(
        cmSystemTools::FileIsDirectory(args.next->GetValue()), args);
    }
    // does a symlink with this name exist
    else if (this->IsKeyword(keyIS_SYMLINK, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::FileIsSymlink(args.next->GetValue()),
                           args);
    }
    // is the given path an absolute path ?
    else if (this->IsKeyword(keyIS_ABSOLUTE, *args.current)) {
      newArgs.ReduceOneArg(
        cmSystemTools::FileIsFullPath(args.next->GetValue()), args);
    }
    // does a command exist
    else if (this->IsKeyword(keyCOMMAND, *args.current)) {
      newArgs.ReduceOneArg(
        static_cast<bool>(
          this->Makefile.GetState()->GetCommand(args.next->GetValue())),
        args);
    }
    // does a policy exist
    else if (this->IsKeyword(keyPOLICY, *args.current)) {
      cmPolicies::PolicyID pid;
      newArgs.ReduceOneArg(
        cmPolicies::GetPolicyID(args.next->GetValue().c_str(), pid), args);
    }
    // does a target exist
    else if (this->IsKeyword(keyTARGET, *args.current)) {
      newArgs.ReduceOneArg(static_cast<bool>(this->Makefile.FindTargetToUse(
                             args.next->GetValue())),
                           args);
    }
    // is a variable defined
    else if (this->IsKeyword(keyDEFINED, *args.current)) {
      const auto& var = args.next->GetValue();
      const auto varNameLen = var.size();

      auto result = false;
      if (looksLikeSpecialVariable(var, "ENV"_s, varNameLen)) {
        const auto env = args.next->GetValue().substr(4, varNameLen - 5);
        result = cmSystemTools::HasEnv(env);
      }

      else if (looksLikeSpecialVariable(var, "CACHE"_s, varNameLen)) {
        const auto cache = args.next->GetValue().substr(6, varNameLen - 7);
        result = static_cast<bool>(
          this->Makefile.GetState()->GetCacheEntryValue(cache));
      }

      else {
        result = this->Makefile.IsDefinitionSet(args.next->GetValue());
      }
      newArgs.ReduceOneArg(result, args);
    }
    // does a test exist
    else if (this->IsKeyword(keyTEST, *args.current)) {
      if (this->Policy64Status == cmPolicies::OLD ||
          this->Policy64Status == cmPolicies::WARN) {
        continue;
      }
      newArgs.ReduceOneArg(
        static_cast<bool>(this->Makefile.GetTest(args.next->GetValue())),
        args);
    }
  }
  return true;
}